

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiSettingsHandler * ImGui::FindSettingsHandler(char *type_name)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  ImGuiSettingsHandler *pIVar3;
  char *in_RDI;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *__end1;
  ImGuiSettingsHandler *__begin1;
  ImVector<ImGuiSettingsHandler> *__range1;
  ImGuiID type_hash;
  ImGuiContext *g;
  ImGuiSettingsHandler *local_30;
  
  pIVar1 = GImGui;
  IVar2 = ImHashStr(in_RDI,0,0);
  local_30 = ImVector<ImGuiSettingsHandler>::begin(&pIVar1->SettingsHandlers);
  pIVar3 = ImVector<ImGuiSettingsHandler>::end(&pIVar1->SettingsHandlers);
  while( true ) {
    if (local_30 == pIVar3) {
      return (ImGuiSettingsHandler *)0x0;
    }
    if (local_30->TypeHash == IVar2) break;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

ImGuiSettingsHandler* ImGui::FindSettingsHandler(const char* type_name)
{
    ImGuiContext& g = *GImGui;
    const ImGuiID type_hash = ImHashStr(type_name);
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.TypeHash == type_hash)
            return &handler;
    return NULL;
}